

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall QPDF::Members::Members(Members *this)

{
  int iVar1;
  InvalidInputSource *this_00;
  EncryptionParameters *this_01;
  Members *this_local;
  
  QPDFLogger::defaultLogger();
  this->unique_id = 0;
  ::qpdf::Tokenizer::Tokenizer(&this->tokenizer);
  this_00 = (InvalidInputSource *)operator_new(0xa8);
  (this_00->super_InputSource).buf_len = 0;
  (this_00->super_InputSource).buf_idx = 0;
  (this_00->super_InputSource).buffer[0x70] = '\0';
  (this_00->super_InputSource).buffer[0x71] = '\0';
  (this_00->super_InputSource).buffer[0x72] = '\0';
  (this_00->super_InputSource).buffer[0x73] = '\0';
  (this_00->super_InputSource).buffer[0x74] = '\0';
  (this_00->super_InputSource).buffer[0x75] = '\0';
  (this_00->super_InputSource).buffer[0x76] = '\0';
  (this_00->super_InputSource).buffer[0x77] = '\0';
  (this_00->super_InputSource).buffer[0x78] = '\0';
  (this_00->super_InputSource).buffer[0x79] = '\0';
  (this_00->super_InputSource).buffer[0x7a] = '\0';
  (this_00->super_InputSource).buffer[0x7b] = '\0';
  (this_00->super_InputSource).buffer[0x7c] = '\0';
  (this_00->super_InputSource).buffer[0x7d] = '\0';
  (this_00->super_InputSource).buffer[0x7e] = '\0';
  (this_00->super_InputSource).buffer[0x7f] = '\0';
  (this_00->super_InputSource).buffer[0x60] = '\0';
  (this_00->super_InputSource).buffer[0x61] = '\0';
  (this_00->super_InputSource).buffer[0x62] = '\0';
  (this_00->super_InputSource).buffer[99] = '\0';
  (this_00->super_InputSource).buffer[100] = '\0';
  (this_00->super_InputSource).buffer[0x65] = '\0';
  (this_00->super_InputSource).buffer[0x66] = '\0';
  (this_00->super_InputSource).buffer[0x67] = '\0';
  (this_00->super_InputSource).buffer[0x68] = '\0';
  (this_00->super_InputSource).buffer[0x69] = '\0';
  (this_00->super_InputSource).buffer[0x6a] = '\0';
  (this_00->super_InputSource).buffer[0x6b] = '\0';
  (this_00->super_InputSource).buffer[0x6c] = '\0';
  (this_00->super_InputSource).buffer[0x6d] = '\0';
  (this_00->super_InputSource).buffer[0x6e] = '\0';
  (this_00->super_InputSource).buffer[0x6f] = '\0';
  (this_00->super_InputSource).buffer[0x50] = '\0';
  (this_00->super_InputSource).buffer[0x51] = '\0';
  (this_00->super_InputSource).buffer[0x52] = '\0';
  (this_00->super_InputSource).buffer[0x53] = '\0';
  (this_00->super_InputSource).buffer[0x54] = '\0';
  (this_00->super_InputSource).buffer[0x55] = '\0';
  (this_00->super_InputSource).buffer[0x56] = '\0';
  (this_00->super_InputSource).buffer[0x57] = '\0';
  (this_00->super_InputSource).buffer[0x58] = '\0';
  (this_00->super_InputSource).buffer[0x59] = '\0';
  (this_00->super_InputSource).buffer[0x5a] = '\0';
  (this_00->super_InputSource).buffer[0x5b] = '\0';
  (this_00->super_InputSource).buffer[0x5c] = '\0';
  (this_00->super_InputSource).buffer[0x5d] = '\0';
  (this_00->super_InputSource).buffer[0x5e] = '\0';
  (this_00->super_InputSource).buffer[0x5f] = '\0';
  (this_00->super_InputSource).buffer[0x40] = '\0';
  (this_00->super_InputSource).buffer[0x41] = '\0';
  (this_00->super_InputSource).buffer[0x42] = '\0';
  (this_00->super_InputSource).buffer[0x43] = '\0';
  (this_00->super_InputSource).buffer[0x44] = '\0';
  (this_00->super_InputSource).buffer[0x45] = '\0';
  (this_00->super_InputSource).buffer[0x46] = '\0';
  (this_00->super_InputSource).buffer[0x47] = '\0';
  (this_00->super_InputSource).buffer[0x48] = '\0';
  (this_00->super_InputSource).buffer[0x49] = '\0';
  (this_00->super_InputSource).buffer[0x4a] = '\0';
  (this_00->super_InputSource).buffer[0x4b] = '\0';
  (this_00->super_InputSource).buffer[0x4c] = '\0';
  (this_00->super_InputSource).buffer[0x4d] = '\0';
  (this_00->super_InputSource).buffer[0x4e] = '\0';
  (this_00->super_InputSource).buffer[0x4f] = '\0';
  (this_00->super_InputSource).buffer[0x30] = '\0';
  (this_00->super_InputSource).buffer[0x31] = '\0';
  (this_00->super_InputSource).buffer[0x32] = '\0';
  (this_00->super_InputSource).buffer[0x33] = '\0';
  (this_00->super_InputSource).buffer[0x34] = '\0';
  (this_00->super_InputSource).buffer[0x35] = '\0';
  (this_00->super_InputSource).buffer[0x36] = '\0';
  (this_00->super_InputSource).buffer[0x37] = '\0';
  (this_00->super_InputSource).buffer[0x38] = '\0';
  (this_00->super_InputSource).buffer[0x39] = '\0';
  (this_00->super_InputSource).buffer[0x3a] = '\0';
  (this_00->super_InputSource).buffer[0x3b] = '\0';
  (this_00->super_InputSource).buffer[0x3c] = '\0';
  (this_00->super_InputSource).buffer[0x3d] = '\0';
  (this_00->super_InputSource).buffer[0x3e] = '\0';
  (this_00->super_InputSource).buffer[0x3f] = '\0';
  (this_00->super_InputSource).buffer[0x20] = '\0';
  (this_00->super_InputSource).buffer[0x21] = '\0';
  (this_00->super_InputSource).buffer[0x22] = '\0';
  (this_00->super_InputSource).buffer[0x23] = '\0';
  (this_00->super_InputSource).buffer[0x24] = '\0';
  (this_00->super_InputSource).buffer[0x25] = '\0';
  (this_00->super_InputSource).buffer[0x26] = '\0';
  (this_00->super_InputSource).buffer[0x27] = '\0';
  (this_00->super_InputSource).buffer[0x28] = '\0';
  (this_00->super_InputSource).buffer[0x29] = '\0';
  (this_00->super_InputSource).buffer[0x2a] = '\0';
  (this_00->super_InputSource).buffer[0x2b] = '\0';
  (this_00->super_InputSource).buffer[0x2c] = '\0';
  (this_00->super_InputSource).buffer[0x2d] = '\0';
  (this_00->super_InputSource).buffer[0x2e] = '\0';
  (this_00->super_InputSource).buffer[0x2f] = '\0';
  (this_00->super_InputSource).buffer[0x10] = '\0';
  (this_00->super_InputSource).buffer[0x11] = '\0';
  (this_00->super_InputSource).buffer[0x12] = '\0';
  (this_00->super_InputSource).buffer[0x13] = '\0';
  (this_00->super_InputSource).buffer[0x14] = '\0';
  (this_00->super_InputSource).buffer[0x15] = '\0';
  (this_00->super_InputSource).buffer[0x16] = '\0';
  (this_00->super_InputSource).buffer[0x17] = '\0';
  (this_00->super_InputSource).buffer[0x18] = '\0';
  (this_00->super_InputSource).buffer[0x19] = '\0';
  (this_00->super_InputSource).buffer[0x1a] = '\0';
  (this_00->super_InputSource).buffer[0x1b] = '\0';
  (this_00->super_InputSource).buffer[0x1c] = '\0';
  (this_00->super_InputSource).buffer[0x1d] = '\0';
  (this_00->super_InputSource).buffer[0x1e] = '\0';
  (this_00->super_InputSource).buffer[0x1f] = '\0';
  (this_00->super_InputSource).buffer[0] = '\0';
  (this_00->super_InputSource).buffer[1] = '\0';
  (this_00->super_InputSource).buffer[2] = '\0';
  (this_00->super_InputSource).buffer[3] = '\0';
  (this_00->super_InputSource).buffer[4] = '\0';
  (this_00->super_InputSource).buffer[5] = '\0';
  (this_00->super_InputSource).buffer[6] = '\0';
  (this_00->super_InputSource).buffer[7] = '\0';
  (this_00->super_InputSource).buffer[8] = '\0';
  (this_00->super_InputSource).buffer[9] = '\0';
  (this_00->super_InputSource).buffer[10] = '\0';
  (this_00->super_InputSource).buffer[0xb] = '\0';
  (this_00->super_InputSource).buffer[0xc] = '\0';
  (this_00->super_InputSource).buffer[0xd] = '\0';
  (this_00->super_InputSource).buffer[0xe] = '\0';
  (this_00->super_InputSource).buffer[0xf] = '\0';
  (this_00->super_InputSource)._vptr_InputSource = (_func_int **)0x0;
  (this_00->super_InputSource).last_offset = 0;
  (this_00->super_InputSource).buf_start = 0;
  anon_unknown.dwarf_1185d8::InvalidInputSource::InvalidInputSource(this_00);
  std::shared_ptr<InputSource>::shared_ptr<(anonymous_namespace)::InvalidInputSource,void>
            (&this->file,this_00);
  std::__cxx11::string::string((string *)&this->last_object_description);
  std::
  shared_ptr<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>_>
  ::shared_ptr(&this->last_ostream_description);
  this->provided_password_is_hex_key = false;
  this->ignore_xref_streams = false;
  this->suppress_warnings = false;
  this->max_warnings = 0;
  this->attempt_recovery = true;
  this->check_mode = false;
  this_01 = (EncryptionParameters *)operator_new(0xe0);
  EncryptionParameters::EncryptionParameters(this_01);
  std::shared_ptr<QPDF::EncryptionParameters>::shared_ptr<QPDF::EncryptionParameters,void>
            (&this->encp,this_01);
  std::__cxx11::string::string((string *)&this->pdf_version);
  std::
  map<QPDFObjGen,_QPDFXRefEntry,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
  ::map(&this->xref_table);
  iVar1 = std::numeric_limits<int>::max();
  this->xref_table_max_id = iVar1 + -1;
  this->xref_table_max_offset = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->deleted_objects);
  std::
  map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
  ::map(&this->obj_cache);
  std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::set(&this->resolving);
  QPDFObjectHandle::QPDFObjectHandle(&this->trailer);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->all_pages);
  this->invalid_page_found = false;
  std::
  map<QPDFObjGen,_int,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_int>_>_>::
  map(&this->pageobj_to_pages_pos);
  this->pushed_inherited_attributes_to_pages = false;
  this->ever_pushed_inherited_attributes_to_pages = false;
  this->ever_called_get_all_pages = false;
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::vector(&this->warnings);
  std::
  map<unsigned_long_long,_QPDF::ObjCopier,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_QPDF::ObjCopier>_>_>
  ::map(&this->object_copiers);
  std::shared_ptr<QPDFObjectHandle::StreamDataProvider>::shared_ptr(&this->copied_streams);
  this->copied_stream_data_provider = (CopiedStreamDataProvider *)0x0;
  this->reconstructed_xref = false;
  this->in_xref_reconstruction = false;
  this->fixed_dangling_refs = false;
  this->immediate_copy_from = false;
  this->in_parse = false;
  this->parsed = false;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->resolved_object_streams);
  this->first_xref_item_offset = 0;
  this->uncompressed_after_compressed = false;
  this->linearization_warnings = false;
  QPDFObjectHandle::QPDFObjectHandle(&this->lindict);
  LinParameters::LinParameters(&this->linp);
  HPageOffset::HPageOffset(&this->page_offset_hints);
  HSharedObject::HSharedObject(&this->shared_object_hints);
  HGeneric::HGeneric(&this->outline_hints);
  LinParameters::LinParameters(&this->c_linp);
  CHPageOffset::CHPageOffset(&this->c_page_offset_data);
  CHSharedObject::CHSharedObject(&this->c_shared_object_data);
  HGeneric::HGeneric(&this->c_outline_data);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->part4);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->part6);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->part7);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->part8);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&this->part9);
  std::
  map<QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<QPDF::ObjUser>,_std::allocator<std::pair<const_QPDF::ObjUser,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  ::map(&this->obj_user_to_objects);
  std::
  map<QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_std::set<QPDF::ObjUser,_std::less<QPDF::ObjUser>,_std::allocator<QPDF::ObjUser>_>_>_>_>
  ::map(&this->object_to_obj_users);
  return;
}

Assistant:

QPDF::Members::Members() :
    log(QPDFLogger::defaultLogger()),
    file(new InvalidInputSource()),
    encp(new EncryptionParameters)
{
}